

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayout::setStatusBar(QMainWindowLayout *this,QStatusBar *sb)

{
  QWidgetItemV2 *this_00;
  
  if (sb != (QStatusBar *)0x0) {
    QLayout::addChildWidget((QLayout *)this,&sb->super_QWidget);
  }
  if (*(long **)(this + 0x708) != (long *)0x0) {
    (**(code **)(**(long **)(this + 0x708) + 8))();
  }
  if (sb == (QStatusBar *)0x0) {
    this_00 = (QWidgetItemV2 *)0x0;
  }
  else {
    this_00 = (QWidgetItemV2 *)operator_new(0x58);
    QWidgetItemV2::QWidgetItemV2(this_00,&sb->super_QWidget);
  }
  *(QWidgetItemV2 **)(this + 0x708) = this_00;
  (**(code **)(*(long *)this + 0x70))(this);
  return;
}

Assistant:

void QMainWindowLayout::setStatusBar(QStatusBar *sb)
{
    if (sb)
        addChildWidget(sb);
    delete statusbar;
    statusbar = sb ? new QWidgetItemV2(sb) : nullptr;
    invalidate();
}